

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O2

int scale_LUT(int *scaling_lut,int index,int bit_depth)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  
  bVar3 = (byte)(bit_depth + -8);
  iVar1 = index >> (bVar3 & 0x1f);
  iVar2 = scaling_lut[iVar1];
  if (iVar1 != 0xff && bit_depth + -8 != 0) {
    iVar2 = iVar2 + ((1 << ((char)bit_depth - 9U & 0x1f)) +
                     (~(-1 << (bVar3 & 0x1f)) & index) * (scaling_lut[(long)iVar1 + 1] - iVar2) >>
                    (bVar3 & 0x1f));
  }
  return iVar2;
}

Assistant:

static int scale_LUT(int *scaling_lut, int index, int bit_depth) {
  int x = index >> (bit_depth - 8);

  if (!(bit_depth - 8) || x == 255)
    return scaling_lut[x];
  else
    return scaling_lut[x] + (((scaling_lut[x + 1] - scaling_lut[x]) *
                                  (index & ((1 << (bit_depth - 8)) - 1)) +
                              (1 << (bit_depth - 9))) >>
                             (bit_depth - 8));
}